

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.h
# Opt level: O1

vbignum_t * __thiscall vbignum_t::operator*(vbignum_t *this,vbignum_t *b)

{
  ushort uVar1;
  ushort *ext1;
  ushort *ext2;
  vbignum_t *pvVar2;
  ushort *new_ext;
  ushort uVar3;
  uint16_t tmp;
  
  pvVar2 = (vbignum_t *)operator_new(8);
  pvVar2->ext_ = (char *)0x0;
  ext1 = (ushort *)this->ext_;
  uVar1 = *ext1;
  ext2 = (ushort *)b->ext_;
  uVar3 = *ext2;
  if (uVar3 < uVar1) {
    uVar3 = uVar1;
  }
  new_ext = (ushort *)operator_new__((ulong)(uVar3 + 1 >> 1) + 5);
  pvVar2->ext_ = (char *)new_ext;
  *new_ext = uVar3;
  *(char *)(new_ext + 2) = '\0';
  CVmObjBigNum::compute_prod_into((char *)new_ext,(char *)ext1,(char *)ext2);
  return pvVar2;
}

Assistant:

vbignum_t *operator *(const vbignum_t &b) const
    {
        vbignum_t *res = new vbignum_t();
        res->init(maxprec(this, &b));
        CVmObjBigNum::compute_prod_into(res->ext_, ext_, b.ext_);
        return res;
    }